

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.h
# Opt level: O0

void __thiscall
di::Context::addFactoryPriv<T9_A>(Context *this,FactoryFunction<T9_A> factoryFunction)

{
  bool bVar1;
  runtime_error *this_00;
  anon_class_16_2_9ea09bd3 local_98;
  undefined1 local_85;
  allocator local_71;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  mapped_type *local_30;
  CtxItem *item;
  type_index local_20;
  type_index instanceTypeIdx;
  FactoryFunction<T9_A> factoryFunction_local;
  Context *this_local;
  
  instanceTypeIdx._M_target = (type_info *)factoryFunction;
  std::type_index::type_index(&local_20,(type_info *)&T9_A::typeinfo);
  item = (CtxItem *)local_20._M_target;
  declareBaseTypes<T9_A>(this,local_20._M_target);
  local_30 = std::
             map<std::type_index,_di::Context::CtxItem,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_di::Context::CtxItem>_>_>
             ::operator[](&this->items,&local_20);
  bVar1 = std::function::operator_cast_to_bool((function *)&local_30->factory);
  if (!bVar1) {
    local_98.factoryFunction = (FactoryFunction<T9_A>)instanceTypeIdx._M_target;
    local_98.this = this;
    std::function<void()>::operator=((function<void()> *)&local_30->factory,&local_98);
    return;
  }
  local_85 = 1;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Factory already registed for type: ",&local_71);
  std::type_info::name((type_info *)&T9_A::typeinfo);
  std::operator+(local_50,(char *)local_70);
  std::runtime_error::runtime_error(this_00,(string *)local_50);
  local_85 = 0;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void addFactoryPriv(FactoryFunction<InstanceType, Args...> factoryFunction)
    {
        auto instanceTypeIdx = std::type_index(typeid(InstanceType));

#ifdef HAS_TR2
        declareBaseTypes< typename std::tr2::bases<InstanceType>::type >( instanceTypeIdx );
#else
        declareBaseTypes<InstanceType>( instanceTypeIdx );
#endif

        CtxItem& item = items[ instanceTypeIdx ];

        if (item.factory)
            throw std::runtime_error(std::string("Factory already registed for type: ") + typeid(InstanceType).name());

        item.factory = [factoryFunction, this]()
        {
            addInstance(factoryFunction( get<Args>()... ), true);
        };
    }